

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::ConsoleReporter::printHeaderString(ConsoleReporter *this,string *_string,size_t indent)

{
  ostream *_stream;
  long lVar1;
  long lVar2;
  Text TStack_98;
  TextAttributes local_40;
  
  lVar1 = std::__cxx11::string::find((char *)_string,0x14d616);
  lVar2 = lVar1 + 2;
  if (lVar1 == -1) {
    lVar2 = 0;
  }
  _stream = (this->super_StreamingReporterBase).stream;
  local_40.width = 0x4f;
  local_40.tabChar = '\t';
  local_40.indent = lVar2 + indent;
  local_40.initialIndent = indent;
  Text::Text(&TStack_98,_string,&local_40);
  operator<<(_stream,&TStack_98);
  std::operator<<(_stream,"\n");
  Text::~Text(&TStack_98);
  return;
}

Assistant:

void printHeaderString( std::string const& _string, std::size_t indent = 0 ) {
            std::size_t i = _string.find( ": " );
            if( i != std::string::npos )
                i+=2;
            else
                i = 0;
            stream << Text( _string, TextAttributes()
                                        .setIndent( indent+i)
                                        .setInitialIndent( indent ) ) << "\n";
        }